

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O3

void __thiscall
QtMWidgets::ScrollIndicator::ScrollIndicator
          (ScrollIndicator *this,QColor *c,Orientation o,QWidget *parent)

{
  undefined8 uVar1;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00194c40;
  *(undefined ***)&this->field_0x10 = &PTR__ScrollIndicator_00194df0;
  this->policy = ScrollIndicatorAsNeeded;
  this->minimumSize = 10;
  this->size = 10;
  (this->pos).xp = 0;
  *(undefined8 *)&(this->pos).yp = 0x300000000;
  this->orientation = o;
  this->needPaint = false;
  uVar1 = *(undefined8 *)((long)&c->ct + 4);
  *(undefined8 *)&this->color = *(undefined8 *)c;
  *(undefined8 *)((long)&(this->color).ct + 4) = uVar1;
  this->animate = false;
  this->alpha = 0xff;
  return;
}

Assistant:

ScrollIndicator::ScrollIndicator( const QColor & c, Qt::Orientation o,
	QWidget * parent )
	:	QWidget( parent )
	,	policy( AbstractScrollArea::ScrollIndicatorAsNeeded )
	,	minimumSize( 10 )
	,	size( minimumSize )
	,	width( 3 )
	,	orientation( o )
	,	needPaint( false )
	,	color( c )
	,	animate( false )
	,	alpha( 255 )
{
}